

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void Curl_free_primary_ssl_config(ssl_primary_config *sslc)

{
  (*Curl_cfree)(sslc->CApath);
  sslc->CApath = (char *)0x0;
  (*Curl_cfree)(sslc->CAfile);
  sslc->CAfile = (char *)0x0;
  (*Curl_cfree)(sslc->clientcert);
  sslc->clientcert = (char *)0x0;
  (*Curl_cfree)(sslc->random_file);
  sslc->random_file = (char *)0x0;
  (*Curl_cfree)(sslc->egdsocket);
  sslc->egdsocket = (char *)0x0;
  (*Curl_cfree)(sslc->cipher_list);
  sslc->cipher_list = (char *)0x0;
  (*Curl_cfree)(sslc->cipher_list13);
  sslc->cipher_list13 = (char *)0x0;
  (*Curl_cfree)(sslc->pinned_key);
  sslc->pinned_key = (char *)0x0;
  return;
}

Assistant:

void Curl_free_primary_ssl_config(struct ssl_primary_config* sslc)
{
  Curl_safefree(sslc->CApath);
  Curl_safefree(sslc->CAfile);
  Curl_safefree(sslc->clientcert);
  Curl_safefree(sslc->random_file);
  Curl_safefree(sslc->egdsocket);
  Curl_safefree(sslc->cipher_list);
  Curl_safefree(sslc->cipher_list13);
  Curl_safefree(sslc->pinned_key);
}